

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
argument_loader<pybind11::detail::value_and_holder&,std::vector<sdf_tools::int3,std::allocator<sdf_tools::int3>>,std::vector<sdf_tools::real3,std::allocator<sdf_tools::real3>>,bool>
::load_impl_sequence<0ul,1ul,2ul,3ul>(void *param_1,long param_2)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<type_caster<value_and_holder>,_type_caster<vector<int3,_allocator<int3>_>,_void>,_type_caster<vector<real3,_allocator<real3>_>,_void>,_type_caster<bool>_>_>
  *__n;
  reference pvVar2;
  handle src;
  reference rVar3;
  bool bStack000000000000005f;
  undefined8 in_stack_00000058;
  list_caster<std::vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_>,_sdf_tools::int3>
  *in_stack_00000060;
  handle in_stack_00000068;
  undefined8 in_stack_ffffffffffffff60;
  undefined1 uVar4;
  type_caster<pybind11::detail::value_and_holder,_void> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  byte bVar5;
  reference local_60;
  PyObject *local_50;
  reference local_48;
  PyObject *local_38;
  reference local_30;
  PyObject *local_20;
  long local_18;
  void *local_10;
  
  bStack000000000000005f = SUB81((ulong)in_stack_00000058 >> 0x38,0);
  uVar4 = (undefined1)((ulong)in_stack_ffffffffffffff60 >> 0x38);
  local_18 = param_2;
  local_10 = param_1;
  __n = std::
        get<0ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<std::vector<sdf_tools::int3,std::allocator<sdf_tools::int3>>,void>,pybind11::detail::type_caster<std::vector<sdf_tools::real3,std::allocator<sdf_tools::real3>>,void>,pybind11::detail::type_caster<bool,void>>
                  ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<std::vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_>,_void>,_pybind11::detail::type_caster<std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>,_void>,_pybind11::detail::type_caster<bool,_void>_>
                    *)0x17d4a9);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      0);
  local_20 = pvVar2->m_ptr;
  local_30 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),(size_type)__n
                       );
  std::_Bit_reference::operator_cast_to_bool(&local_30);
  bVar1 = type_caster<pybind11::detail::value_and_holder,_void>::load
                    (in_stack_ffffffffffffff68,(handle)param_1,(bool)uVar4);
  bVar5 = 1;
  if (bVar1) {
    std::
    get<1ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<std::vector<sdf_tools::int3,std::allocator<sdf_tools::int3>>,void>,pybind11::detail::type_caster<std::vector<sdf_tools::real3,std::allocator<sdf_tools::real3>>,void>,pybind11::detail::type_caster<bool,void>>
              ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<std::vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_>,_void>,_pybind11::detail::type_caster<std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>,_void>,_pybind11::detail::type_caster<bool,_void>_>
                *)0x17d52e);
    pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                       ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                        (local_18 + 8),1);
    local_38 = pvVar2->m_ptr;
    local_48 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          CONCAT17(bVar5,in_stack_ffffffffffffff80),(size_type)__n);
    std::_Bit_reference::operator_cast_to_bool(&local_48);
    bVar1 = list_caster<std::vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_>,_sdf_tools::int3>
            ::load(in_stack_00000060,in_stack_00000068,bStack000000000000005f);
    bVar5 = 1;
    if (bVar1) {
      std::
      get<2ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<std::vector<sdf_tools::int3,std::allocator<sdf_tools::int3>>,void>,pybind11::detail::type_caster<std::vector<sdf_tools::real3,std::allocator<sdf_tools::real3>>,void>,pybind11::detail::type_caster<bool,void>>
                ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<std::vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_>,_void>,_pybind11::detail::type_caster<std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>,_void>,_pybind11::detail::type_caster<bool,_void>_>
                  *)0x17d5ac);
      pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                         ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                          (local_18 + 8),2);
      local_50 = pvVar2->m_ptr;
      local_60 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT17(bVar5,in_stack_ffffffffffffff80),(size_type)__n);
      std::_Bit_reference::operator_cast_to_bool(&local_60);
      bVar1 = list_caster<std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>,_sdf_tools::real3>
              ::load((list_caster<std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>,_sdf_tools::real3>
                      *)in_stack_00000060,in_stack_00000068,bStack000000000000005f);
      bVar5 = 1;
      if (bVar1) {
        std::
        get<3ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<std::vector<sdf_tools::int3,std::allocator<sdf_tools::int3>>,void>,pybind11::detail::type_caster<std::vector<sdf_tools::real3,std::allocator<sdf_tools::real3>>,void>,pybind11::detail::type_caster<bool,void>>
                  ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<std::vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_>,_void>,_pybind11::detail::type_caster<std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>,_void>,_pybind11::detail::type_caster<bool,_void>_>
                    *)0x17d627);
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),3);
        rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)
                           CONCAT17(bVar5,in_stack_ffffffffffffff80),(size_type)__n);
        uVar4 = (undefined1)((ulong)__n >> 0x38);
        src.m_ptr = (PyObject *)rVar3._M_p;
        std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff88);
        bVar1 = type_caster<bool,_void>::load
                          ((type_caster<bool,_void> *)CONCAT17(bVar5,in_stack_ffffffffffffff80),src,
                           (bool)uVar4);
        bVar5 = bVar1 ^ 0xff;
      }
    }
  }
  return (bVar5 & 1) == 0;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }